

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O1

void __thiscall RBTS<UF>::PerformLabeling(RBTS<UF> *this)

{
  int iVar1;
  int *piVar2;
  Mat1b *pMVar3;
  long lVar4;
  Mat1i *pMVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  uint *puVar11;
  void *pvVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  uint *img_labels_row_prev;
  uint *img_labels_row;
  uchar *img_row;
  long local_128;
  ulong local_f8;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar2 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar2,piVar2[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar11 = (uint *)operator_new__((ulong)(((*(int *)&pMVar3->field_0xc -
                                            (*(int *)&pMVar3->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                           ((*(int *)&pMVar3->field_0x8 -
                                            (*(int *)&pMVar3->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                   << 2);
  UF::P_ = puVar11;
  *puVar11 = 0;
  UF::length_ = 1;
  iVar1 = *(int *)&pMVar3->field_0xc;
  uVar16 = *(uint *)&pMVar3->field_0x8;
  uVar21 = 0xffffffffffffffff;
  if (-6 < (long)iVar1) {
    uVar21 = (long)(iVar1 / 2) * 4 + 8;
  }
  pvVar12 = operator_new__(uVar21);
  pvVar13 = operator_new__(uVar21);
  if (0 < (int)uVar16) {
    uVar22 = (long)(iVar1 / 2) + 2;
    lVar17 = *(long *)&pMVar3->field_0x10;
    lVar4 = **(long **)&pMVar3->field_0x48;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar25 = *(long *)&pMVar5->field_0x10;
    lVar29 = **(long **)&pMVar5->field_0x48;
    uVar24 = 0;
    uVar19 = 0;
    uVar21 = 0;
    local_f8 = 0;
    uVar20 = 0;
    lVar35 = lVar25;
    local_128 = lVar17;
    do {
      if (0 < iVar1) {
        lVar28 = lVar29 * uVar24 + lVar25;
        lVar14 = lVar28 - lVar29;
        iVar23 = (int)uVar24 * iVar1;
        iVar34 = 0;
        do {
          lVar32 = (long)iVar34;
          iVar36 = iVar34;
          if (*(char *)(lVar4 * uVar24 + lVar17 + lVar32) != '\0') {
            iVar33 = iVar34 + iVar23;
            *(int *)((long)pvVar12 + uVar19 * 4) = iVar33;
            uVar19 = (uVar19 + 1) % uVar22;
            iVar30 = iVar34 + 1;
            if (iVar34 + 1 < iVar1) {
              iVar30 = iVar1;
            }
            do {
              lVar32 = lVar32 + 1;
              iVar10 = iVar30;
              if (iVar1 <= lVar32) break;
              iVar10 = iVar36 + 1;
              iVar36 = iVar10;
            } while (*(char *)(local_128 + lVar32) != '\0');
            iVar36 = iVar10 + -1;
            iVar37 = iVar36 + iVar23;
            *(int *)((long)pvVar13 + local_f8 * 4) = iVar37;
            uVar27 = UF::length_;
            local_f8 = (local_f8 + 1) % uVar22;
            iVar30 = *(int *)((long)pvVar13 + uVar21 * 4);
            while (iVar30 < (int)((iVar33 - iVar1) - (uint)(iVar34 != 0))) {
              uVar20 = (uVar20 + 1) % uVar22;
              uVar21 = (uVar21 + 1) % uVar22;
              iVar30 = *(int *)((long)pvVar13 + uVar21 * 4);
            }
            iVar31 = *(int *)((long)pvVar12 + uVar20 * 4);
            iVar37 = iVar37 - iVar1;
            iVar10 = (uint)(iVar10 != iVar1) + iVar37;
            if (iVar10 < iVar31) {
              puVar11[UF::length_] = UF::length_;
              UF::length_ = UF::length_ + 1;
              uVar7 = (uint)((long)iVar33 % (long)iVar1);
              uVar26 = (iVar36 - iVar34) + uVar7 + 1;
              if (uVar7 < uVar26) {
                uVar15 = (long)iVar33 % (long)iVar1 & 0xffffffff;
                do {
                  *(uint *)(lVar35 + uVar15 * 4) = uVar27;
                  uVar15 = uVar15 + 1;
                } while (uVar26 != uVar15);
              }
            }
            else {
              uVar27 = *(uint *)(lVar14 + (long)(iVar31 % iVar1) * 4);
              uVar7 = (uint)((long)iVar33 % (long)iVar1);
              uVar26 = (iVar36 - iVar34) + uVar7 + 1;
              if (uVar7 < uVar26) {
                uVar15 = (long)iVar33 % (long)iVar1 & 0xffffffff;
                do {
                  *(uint *)(lVar35 + uVar15 * 4) = uVar27;
                  uVar15 = uVar15 + 1;
                } while (uVar26 != uVar15);
              }
              bVar6 = iVar30 <= iVar37;
              if (iVar30 <= iVar37) {
                bVar9 = false;
                do {
                  if (bVar9) {
                    uVar26 = *(uint *)(lVar14 + (long)(iVar31 % iVar1) * 4);
                    do {
                      uVar18 = uVar26;
                      uVar26 = puVar11[uVar18];
                      uVar8 = uVar27;
                    } while (puVar11[uVar18] < uVar18);
                    do {
                      uVar26 = uVar8;
                      uVar8 = puVar11[uVar26];
                    } while (puVar11[uVar26] < uVar26);
                    uVar8 = uVar26;
                    if (uVar18 >= uVar26 && uVar18 != uVar26) {
                      uVar8 = uVar18;
                    }
                    if (uVar18 < uVar26) {
                      uVar26 = uVar18;
                    }
                    puVar11[uVar8] = uVar26;
                  }
                  uVar20 = (uVar20 + 1) % uVar22;
                  iVar31 = *(int *)((long)pvVar12 + uVar20 * 4);
                  uVar21 = (uVar21 + 1) % uVar22;
                  iVar30 = *(int *)((long)pvVar13 + uVar21 * 4);
                  bVar9 = true;
                } while (iVar30 <= iVar37);
              }
              if (iVar30 <= iVar37) {
                do {
                  uVar20 = (uVar20 + 1) % uVar22;
                  uVar21 = (uVar21 + 1) % uVar22;
                } while (*(int *)((long)pvVar13 + uVar21 * 4) <= iVar37);
                iVar31 = *(int *)((long)pvVar12 + uVar20 * 4);
                bVar6 = true;
              }
              if ((iVar31 <= iVar10) && (bVar6)) {
                uVar27 = *(uint *)(lVar28 + (long)(int)uVar7 * 4);
                do {
                  uVar26 = uVar27;
                  uVar27 = puVar11[uVar26];
                  uVar7 = *(uint *)(lVar14 + (long)(iVar31 % iVar1) * 4);
                } while (puVar11[uVar26] < uVar26);
                do {
                  uVar27 = uVar7;
                  uVar7 = puVar11[uVar27];
                } while (puVar11[uVar27] < uVar27);
                uVar7 = uVar27;
                if (uVar26 >= uVar27 && uVar26 != uVar27) {
                  uVar7 = uVar26;
                }
                if (uVar26 < uVar27) {
                  uVar27 = uVar26;
                }
                puVar11[uVar7] = uVar27;
              }
            }
          }
          iVar34 = iVar36 + 1;
        } while (iVar34 < iVar1);
      }
      uVar24 = uVar24 + 1;
      local_128 = local_128 + lVar4;
      lVar35 = lVar35 + lVar29;
    } while (uVar24 != uVar16);
  }
  uVar21 = (ulong)UF::length_;
  uVar16 = 1;
  if (1 < uVar21) {
    uVar20 = 1;
    do {
      if (puVar11[uVar20] < uVar20) {
        puVar11[uVar20] = puVar11[puVar11[uVar20]];
      }
      else {
        puVar11[uVar20] = uVar16;
        uVar16 = uVar16 + 1;
      }
      uVar20 = uVar20 + 1;
    } while (uVar21 != uVar20);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar16;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar5->field_0x8) {
    lVar17 = *(long *)&pMVar5->field_0x10;
    lVar4 = **(long **)&pMVar5->field_0x48;
    lVar25 = 0;
    do {
      iVar1 = *(int *)&pMVar5->field_0xc;
      if ((long)iVar1 != 0) {
        lVar29 = 0;
        do {
          *(uint *)(lVar17 + lVar29) = puVar11[*(uint *)(lVar17 + lVar29)];
          lVar29 = lVar29 + 4;
        } while ((long)iVar1 * 4 != lVar29);
      }
      lVar25 = lVar25 + 1;
      lVar17 = lVar17 + lVar4;
    } while (lVar25 < *(int *)&pMVar5->field_0x8);
  }
  operator_delete__(puVar11);
  operator_delete__(pvVar13);
  operator_delete__(pvVar12);
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask (Rosenfeld)
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols); // w = N in the paper naming convention
        int h(img_.rows);

        // Circular Buffers
        int buffer_capacity = w / 2 + 2;
        CircularBuffer<int> s_queue(buffer_capacity);
        CircularBuffer<int> e_queue(buffer_capacity);

        for (int r = 0; r < h; r += 1) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            // const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 1) {

                // Is there a new run ?
                if (img_row[c] == 0) {
                    continue;
                }

                // clb (consider left border) and crb (consider right border) are used to handle border cases ignored by
                // the original paper.

                // Yes (new run)
                // 1) We need to record the new run r(s,e)
                int clb = c != 0; // Consider left border
                int s = s_queue.Enqueue(w * r + c++); // Current run starting index
                for (; c < w && img_row[c] > 0; c += 1) {}
                int crb = c != w; // Consider right border (derived by c - 1 != w - 1)
                int e = e_queue.Enqueue(w * r + --c); // Current run end index

                // 2) Discard all the runs until a run r(h,t) that end after/at s - N - 1 (t in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | |t|>| | | | | | |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // This run always exists. It is at most the run we just found.
                int h = s_queue.Front();
                int t = e_queue.Front();
                while (t < s - w - clb) {
                    h = s_queue.DequeueAndFront();
                    t = e_queue.DequeueAndFront();
                }

                // 3A) If the run r(h,t) starts before/at e - N + 1 (h in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | | | | | | |<|h| |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // it connects to the current run so we update the label of the current run
                // with that of the run(h,t), taking the value from p(h) -> p(r - 1, h % w)
                // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                // is for the handling of (left) border cases that were ignored by the original 
                // paper in which the border is always considered black (background).
                bool next = false;
                if (h <= e - w + crb) {
                    unsigned val = img_labels_row_prev[h % w];
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }

                    // 3B) Moreover, we check for all the following run that end before/at e - N (t
                    // in the following schema), we perform a label merge of that run with the
                    // current one and we remove them from the queues (no other following run can
                    // be directly connected with these).
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | |<|t| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The label of the current run is val. The label of the run we are analyzing 
                    // from the queue is found at p(h) -> p(r - 1, h % w).
                    while (t <= e - w) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row_prev[h % w], val);
                        }
                        next = true;
                        h = s_queue.DequeueAndFront();
                        t = e_queue.DequeueAndFront();
                    }

                    // 4) We check for the next run which ends after/at e - N + 1 (t in the following
                    // schema. It always exists and it is at most the current run.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | | |t|>|
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    while (t < e - w + 1) {
                        next = true;
                        s_queue.Dequeue();
                        e_queue.Dequeue();
                        h = s_queue.Front();
                        t = e_queue.Front();
                    }

                    // We must keep the run in the list but we may need to merge labels:
                    // If the run p(h, t) starts before/at e - N + 1 (h in the following
                    // schema) it connects to the current run so we need to merge labels.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | |<|h| |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                    // is for the handling of (left) border cases that were ignored by the original 
                    // paper in which the border is always considered black (background).
                    if (h <= e - w + crb) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row[s % w], img_labels_row_prev[h % w]);
                        }
                    }
                }
                else {
                    // Otherwise it is a run not connected to any other, so we need a new label
                    unsigned val = LabelsSolver::NewLabel();
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }
                }

            }//End columns's for
        }//End rows's for

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int* img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int* img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int* img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }